

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_reader
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  t_field *tfield;
  pointer pptVar4;
  char *pcVar5;
  string local_198;
  string local_178;
  undefined4 local_154;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_154 = (undefined4)CONCAT71(in_register_00000009,pointers);
  if (this->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_198);
    poVar3 = std::operator<<(poVar3,"template <class Protocol_>");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_178);
    poVar3 = std::operator<<(poVar3,"uint32_t ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3,"::read(Protocol_* iprot) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"uint32_t ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    poVar3 = std::operator<<(poVar3,"::read(::apache::thrift::protocol::TProtocol* iprot) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,
                           "::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"uint32_t xfer = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,"std::string fname;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"::apache::thrift::protocol::TType ftype;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_d0);
  poVar3 = std::operator<<(poVar3,"int16_t fid;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,"xfer += iprot->readStructBegin(fname);");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"using ::apache::thrift::protocol::TProtocolException;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if ((*pptVar4)->req_ == T_REQUIRED) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"bool isset_");
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
      poVar3 = std::operator<<(poVar3," = false;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"while (true)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"xfer += iprot->readFieldBegin(fname, ftype, fid);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"if (ftype == ::apache::thrift::protocol::T_STOP) {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_178);
  poVar3 = std::operator<<(poVar3,"  break;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_198);
    poVar3 = std::operator<<(poVar3,"xfer += iprot->skip(ftype);");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"switch (fid)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar4 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"case ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
      poVar3 = std::operator<<(poVar3,":");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "if (ftype == ";
      poVar3 = std::operator<<(poVar3,"if (ftype == ");
      type_to_enum_abi_cxx11_(&local_198,(t_cpp_generator *)pcVar5,(*pptVar4)->type_);
      poVar3 = std::operator<<(poVar3,(string *)&local_198);
      poVar3 = std::operator<<(poVar3,") {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_198);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      tfield = *pptVar4;
      pcVar5 = "this->__isset.";
      if (tfield->req_ == T_REQUIRED) {
        pcVar5 = "isset_";
      }
      if ((char)local_154 == '\0') {
LAB_00170401:
        std::__cxx11::string::string((string *)&local_b0,"this->",(allocator *)&local_198);
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_178);
        generate_deserialize_field(this,out,tfield,&local_b0,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        iVar2 = (*(tfield->type_->super_t_doc)._vptr_t_doc[0xc])();
        tfield = *pptVar4;
        if ((char)iVar2 != '\0') goto LAB_00170401;
        std::__cxx11::string::string((string *)&local_90,"(*(this->",(allocator *)&local_198);
        std::__cxx11::string::string((string *)&local_50,"))",(allocator *)&local_178);
        generate_deserialize_field(this,out,tfield,&local_90,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
      }
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_198);
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
      poVar3 = std::operator<<(poVar3," = true;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_198);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_198);
      poVar3 = std::operator<<(poVar3,"} else {");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,"  xfer += iprot->skip(ftype);");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_130);
      poVar3 = std::operator<<(poVar3,"break;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
    }
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_198);
    poVar3 = std::operator<<(poVar3,"default:");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_178);
    poVar3 = std::operator<<(poVar3,"  xfer += iprot->skip(ftype);");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3,"  break;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"xfer += iprot->readFieldEnd();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_198);
  poVar3 = std::operator<<(poVar3,"xfer += iprot->readStructEnd();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_198);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if ((*pptVar4)->req_ == T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_198);
      poVar3 = std::operator<<(poVar3,"if (!isset_");
      poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
      poVar3 = std::operator<<(poVar3,')');
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_178);
      poVar3 = std::operator<<(poVar3,
                               "  throw TProtocolException(TProtocolException::INVALID_DATA);");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
    }
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"return xfer;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_reader(ostream& out, t_struct* tstruct, bool pointers) {
  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::read(Protocol_* iprot) {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::read(::apache::thrift::protocol::TProtocol* iprot) {" << endl;
  }
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables
  out << endl
      << indent() << "::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);" << endl
      << indent() << "uint32_t xfer = 0;" << endl
      << indent() << "std::string fname;" << endl
      << indent() << "::apache::thrift::protocol::TType ftype;" << endl
      << indent() << "int16_t fid;" << endl
      << endl
      << indent() << "xfer += iprot->readStructBegin(fname);" << endl
      << endl
      << indent() << "using ::apache::thrift::protocol::TProtocolException;" << endl
      << endl;

  // Required variables aren't in __isset, so we need tmp vars to check them.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      indent(out) << "bool isset_" << (*f_iter)->get_name() << " = false;" << endl;
  }
  out << endl;

  // Loop over reading in fields
  indent(out) << "while (true)" << endl;
  scope_up(out);

  // Read beginning field marker
  indent(out) << "xfer += iprot->readFieldBegin(fname, ftype, fid);" << endl;

  // Check for field STOP marker
  out << indent() << "if (ftype == ::apache::thrift::protocol::T_STOP) {" << endl << indent()
      << "  break;" << endl << indent() << "}" << endl;

  if (fields.empty()) {
    out << indent() << "xfer += iprot->skip(ftype);" << endl;
  } else {
    // Switch statement on the field we are reading
    indent(out) << "switch (fid)" << endl;

    scope_up(out);

    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
      indent_up();
      indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
      indent_up();

      const char* isset_prefix = ((*f_iter)->get_req() != t_field::T_REQUIRED) ? "this->__isset."
                                                                               : "isset_";

#if 0
          // This code throws an exception if the same field is encountered twice.
          // We've decided to leave it out for performance reasons.
          // TODO(dreiss): Generate this code and "if" it out to make it easier
          // for people recompiling thrift to include it.
          out <<
            indent() << "if (" << isset_prefix << (*f_iter)->get_name() << ")" << endl <<
            indent() << "  throw TProtocolException(TProtocolException::INVALID_DATA);" << endl;
#endif

      if (pointers && !(*f_iter)->get_type()->is_xception()) {
        generate_deserialize_field(out, *f_iter, "(*(this->", "))");
      } else {
        generate_deserialize_field(out, *f_iter, "this->");
      }
      out << indent() << isset_prefix << (*f_iter)->get_name() << " = true;" << endl;
      indent_down();
      out << indent() << "} else {" << endl << indent() << "  xfer += iprot->skip(ftype);" << endl
          <<
          // TODO(dreiss): Make this an option when thrift structs
          // have a common base class.
          // indent() << "  throw TProtocolException(TProtocolException::INVALID_DATA);" << endl <<
          indent() << "}" << endl << indent() << "break;" << endl;
      indent_down();
    }

    // In the default case we skip the field
    out << indent() << "default:" << endl << indent() << "  xfer += iprot->skip(ftype);" << endl
        << indent() << "  break;" << endl;

    scope_down(out);
  } //!fields.empty()
  // Read field end marker
  indent(out) << "xfer += iprot->readFieldEnd();" << endl;

  scope_down(out);

  out << endl << indent() << "xfer += iprot->readStructEnd();" << endl;

  // Throw if any required fields are missing.
  // We do this after reading the struct end so that
  // there might possibly be a chance of continuing.
  out << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      out << indent() << "if (!isset_" << (*f_iter)->get_name() << ')' << endl << indent()
          << "  throw TProtocolException(TProtocolException::INVALID_DATA);" << endl;
  }

  indent(out) << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}